

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall String::trim(String *this,char *chars)

{
  usize *puVar1;
  usize uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  String local_58;
  
  uVar2 = this->data->len;
  if (uVar2 != 0) {
    pcVar3 = this->data->str;
    pcVar8 = pcVar3;
    if (0 < (long)uVar2) {
      do {
        pcVar4 = strchr(chars,(int)*pcVar8);
        if (pcVar4 == (char *)0x0) break;
        pcVar8 = pcVar8 + 1;
      } while (pcVar8 < pcVar3 + uVar2);
    }
    pcVar7 = pcVar3 + (uVar2 - 1);
    pcVar4 = pcVar8;
    do {
      pcVar6 = pcVar4;
      if (pcVar7 <= pcVar8) break;
      pcVar5 = strchr(chars,(int)*pcVar7);
      pcVar7 = pcVar7 + -1;
      pcVar4 = pcVar6 + 1;
    } while (pcVar5 != (char *)0x0);
    if (pcVar3 != pcVar6) {
      substr(&local_58,this,(long)pcVar8 - (long)pcVar3,(long)(pcVar3 + uVar2) - (long)pcVar6);
      operator=(this,&local_58);
      if ((local_58.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_58.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
          operator_delete__(local_58.data);
        }
      }
    }
  }
  return this;
}

Assistant:

String& String::trim(const char* chars)
{
  if(data->len)
  {
    const char* start = data->str;
    const char* p = start;
    const char* end = start + data->len;
    for(; p < end; ++p)
      if(!strchr(chars, *p))
        break;
    --end;
    for(; end > p; --end)
      if(!strchr(chars, *end))
        break;
    ++end;
    size_t newLen = end - p;
    if(newLen != data->len)
      *this = substr(p - start, newLen);
  }
  return *this;
}